

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.hpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::~CompilerCPP(CompilerCPP *this)

{
  CompilerCPP *this_local;
  
  ~CompilerCPP(this);
  operator_delete(this);
  return;
}

Assistant:

explicit CompilerCPP(std::vector<uint32_t> spirv_)
	    : CompilerGLSL(std::move(spirv_))
	{
	}